

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall
QMenuPrivate::scrollMenu(QMenuPrivate *this,ScrollDirection direction,bool page,bool active)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QMenu *pQVar5;
  QStyle *pQVar6;
  qsizetype qVar7;
  QList<QRect> *this_00;
  uint in_ESI;
  QMenuPrivate *in_RDI;
  int visible;
  int scrollerArea;
  int iHeight;
  int saccum_1;
  int i_1;
  bool scrolled;
  QMenuPrivate *in_stack_00000050;
  int saccum;
  int i;
  int offset;
  int fw;
  int vmargin;
  int botScroll;
  int topScroll;
  QMenu *q;
  QMenuPrivate *in_stack_ffffffffffffff78;
  QMenuPrivate *in_stack_ffffffffffffff80;
  int local_64;
  int local_60;
  int local_5c;
  int local_4c;
  int local_40;
  int local_3c;
  int local_34;
  int local_30;
  
  pQVar5 = q_func(in_RDI);
  if (in_RDI->scroll == (QMenuScroller *)0x0) {
    return;
  }
  if ((in_RDI->scroll->scrollFlags & in_ESI) == 0) {
    return;
  }
  updateActionRects(in_stack_ffffffffffffff78);
  if ((in_RDI->scroll->scrollFlags & 1) == 0) {
    local_5c = 0;
  }
  else {
    local_5c = scrollerHeight(in_stack_ffffffffffffff80);
  }
  if ((in_RDI->scroll->scrollFlags & 2) == 0) {
    local_60 = 0;
  }
  else {
    local_60 = scrollerHeight(in_stack_ffffffffffffff80);
  }
  pQVar6 = QWidget::style((QWidget *)in_stack_ffffffffffffff78);
  local_64 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x1d,0,pQVar5);
  pQVar6 = QWidget::style((QWidget *)in_stack_ffffffffffffff78);
  iVar2 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x1e,0,pQVar5);
  if (local_5c == 0) {
    local_64 = 0;
  }
  else {
    local_64 = local_5c - local_64;
  }
  if (in_ESI == 1) {
    local_30 = 0;
    local_34 = 0;
    while( true ) {
      qVar7 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
      if (qVar7 <= local_30) {
        return;
      }
      QList<QRect>::at((QList<QRect> *)in_stack_ffffffffffffff80,
                       (qsizetype)in_stack_ffffffffffffff78);
      iVar2 = QRect::height((QRect *)in_stack_ffffffffffffff78);
      local_34 = local_34 - iVar2;
      if (local_34 <= in_RDI->scroll->scrollOffset - local_64) break;
      local_30 = local_30 + 1;
    }
    QList<QAction_*>::at
              ((QList<QAction_*> *)in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    scrollMenu(in_stack_00000050,_saccum_1,iHeight,scrollerArea._3_1_);
    return;
  }
  if (in_ESI != 2) {
    return;
  }
  bVar1 = false;
  local_40 = 0;
  for (local_3c = 0; qVar7 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions),
      local_3c < qVar7; local_3c = local_3c + 1) {
    QList<QRect>::at((QList<QRect> *)in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78)
    ;
    iVar3 = QRect::height((QRect *)in_stack_ffffffffffffff78);
    local_40 = local_40 - iVar3;
    if (local_40 <= in_RDI->scroll->scrollOffset - local_64) {
      iVar3 = QWidget::height((QWidget *)0x644802);
      local_4c = (in_RDI->scroll->scrollOffset - local_64) - local_40;
      goto LAB_00644839;
    }
  }
  goto LAB_00644908;
  while( true ) {
    QList<QRect>::at(this_00,(qsizetype)in_stack_ffffffffffffff78);
    iVar4 = QRect::height((QRect *)in_stack_ffffffffffffff78);
    local_4c = iVar4 + local_4c;
    if (((iVar3 - local_60) + iVar2 * -2) - local_5c < local_4c) break;
LAB_00644839:
    local_3c = local_3c + 1;
    this_00 = (QList<QRect> *)(long)local_3c;
    qVar7 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
    if (qVar7 <= (long)this_00) goto LAB_00644908;
  }
  bVar1 = true;
  QList<QAction_*>::at((QList<QAction_*> *)this_00,(qsizetype)in_stack_ffffffffffffff78);
  scrollMenu(in_stack_00000050,_saccum_1,iHeight,scrollerArea._3_1_);
LAB_00644908:
  if (!bVar1) {
    in_RDI->scroll->scrollFlags = in_RDI->scroll->scrollFlags & 0xfd;
    QWidget::update((QWidget *)in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void QMenuPrivate::scrollMenu(QMenuScroller::ScrollDirection direction, bool page, bool active)
{
    Q_Q(QMenu);
    if (!scroll || !(scroll->scrollFlags & direction)) //not really possible...
        return;
    updateActionRects();
    const int topScroll = (scroll->scrollFlags & QMenuScroller::ScrollUp)   ? scrollerHeight() : 0;
    const int botScroll = (scroll->scrollFlags & QMenuScroller::ScrollDown) ? scrollerHeight() : 0;
    const int vmargin = q->style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, q);
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, q);
    const int offset = topScroll ? topScroll-vmargin : 0;
    if (direction == QMenuScroller::ScrollUp) {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            saccum -= actionRects.at(i).height();
            if (saccum <= scroll->scrollOffset-offset) {
                scrollMenu(actions.at(i), page ? QMenuScroller::ScrollBottom : QMenuScroller::ScrollTop, active);
                break;
            }
        }
    } else if (direction == QMenuScroller::ScrollDown) {
        bool scrolled = false;
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            const int iHeight = actionRects.at(i).height();
            saccum -= iHeight;
            if (saccum <= scroll->scrollOffset-offset) {
                const int scrollerArea = q->height() - botScroll - fw*2;
                int visible = (scroll->scrollOffset-offset) - saccum;
                for(i++ ; i < actions.size(); i++) {
                    visible += actionRects.at(i).height();
                    if (visible > scrollerArea - topScroll) {
                        scrolled = true;
                        scrollMenu(actions.at(i), page ? QMenuScroller::ScrollTop : QMenuScroller::ScrollBottom, active);
                        break;
                    }
                }
                break;
            }
        }
        if (!scrolled) {
            scroll->scrollFlags &= ~QMenuScroller::ScrollDown;
            q->update();
        }
    }
}